

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::ExtractScene(BlenderImporter *this,Scene *out,FileDatabase *file)

{
  uint uVar1;
  bool bVar2;
  reference ppVar3;
  const_reference this_00;
  element_type *this_01;
  Logger *this_02;
  Statistics *pSVar4;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar5;
  basic_formatter *this_03;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  reference local_c0;
  FileBlockHead *bl;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Assimp::Blender::FileBlockHead> *__range1;
  Structure *ss;
  string local_90;
  _Self local_70 [3];
  allocator<char> local_51;
  key_type local_50;
  _Self local_30;
  const_iterator it;
  FileBlockHead *block;
  FileDatabase *file_local;
  Scene *out_local;
  BlenderImporter *this_local;
  
  it._M_node = (_Base_ptr)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Scene",&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(&(file->dna).indices,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(&(file->dna).indices);
  bVar2 = std::operator==(&local_30,local_70);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"There is no `Scene` structure record",
               (allocator<char> *)((long)&ss + 7));
    LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ss + 7));
  }
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
           ::operator*(&local_30);
  this_00 = std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
            operator[](&(file->dna).structures.
                        super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                       ,ppVar3->second);
  __end1 = std::
           vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>::
           begin(&(file->entries).
                  super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                );
  bl = (FileBlockHead *)
       std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
       ::end(&(file->entries).
              super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
            );
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Assimp::Blender::FileBlockHead_*,_std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>_>
                                *)&bl);
    if (!bVar2) {
LAB_00742fc4:
      if (it._M_node == (_Base_ptr)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"There is not a single `Scene` record to load",&local_e1);
        LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
      }
      this_01 = std::
                __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&file->reader);
      StreamReader<true,_true>::SetCurrentPos(this_01,(ulong)(it._M_node)->_M_color);
      Blender::Structure::Convert<Assimp::Blender::Scene>(this_00,out,file);
      this_02 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[22]>(&local_280,(char (*) [22])"(Stats) Fields read: ");
      pSVar4 = Blender::FileDatabase::stats(file);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_280,&pSVar4->fields_read);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,(char (*) [22])", pointers resolved: ");
      pSVar4 = Blender::FileDatabase::stats(file);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,&pSVar4->pointers_resolved);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,(char (*) [15])", cache hits: ");
      pSVar4 = Blender::FileDatabase::stats(file);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,&pSVar4->cache_hits);
      pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar5,(char (*) [19])", cached objects: ");
      pSVar4 = Blender::FileDatabase::stats(file);
      this_03 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar5,&pSVar4->cached_objects);
      Formatter::basic_formatter::operator_cast_to_string(&local_108,this_03);
      Logger::info(this_02,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_280);
      return;
    }
    local_c0 = __gnu_cxx::
               __normal_iterator<const_Assimp::Blender::FileBlockHead_*,_std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>_>
               ::operator*(&__end1);
    uVar1 = local_c0->dna_index;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             ::operator*(&local_30);
    if ((ulong)uVar1 == ppVar3->second) {
      it._M_node = (_Base_ptr)local_c0;
      goto LAB_00742fc4;
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::Blender::FileBlockHead_*,_std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void BlenderImporter::ExtractScene(Scene& out, const FileDatabase& file)
{
    const FileBlockHead* block = NULL;
    std::map<std::string,size_t>::const_iterator it = file.dna.indices.find("Scene");
    if (it == file.dna.indices.end()) {
        ThrowException("There is no `Scene` structure record");
    }

    const Structure& ss = file.dna.structures[(*it).second];

    // we need a scene somewhere to start with.
    for(const FileBlockHead& bl :file.entries) {

        // Fix: using the DNA index is more reliable to locate scenes
        //if (bl.id == "SC") {

        if (bl.dna_index == (*it).second) {
            block = &bl;
            break;
        }
    }

    if (!block) {
        ThrowException("There is not a single `Scene` record to load");
    }

    file.reader->SetCurrentPos(block->start);
    ss.Convert(out,file);

#ifndef ASSIMP_BUILD_BLENDER_NO_STATS
    ASSIMP_LOG_INFO_F(
        "(Stats) Fields read: " ,file.stats().fields_read,
        ", pointers resolved: " ,file.stats().pointers_resolved,
        ", cache hits: "        ,file.stats().cache_hits,
        ", cached objects: "    ,file.stats().cached_objects
    );
#endif
}